

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool Interpreter::Equals(string *a,string *b)

{
  pointer pcVar1;
  long *plVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  bool bVar7;
  string aa;
  string bb;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  pcVar1 = (a->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar1,pcVar1 + a->_M_string_length)
  ;
  pcVar1 = (b->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar1,pcVar1 + b->_M_string_length)
  ;
  sVar3 = local_60;
  plVar2 = local_68;
  if (local_60 != 0) {
    sVar5 = 0;
    do {
      iVar4 = tolower((int)*(char *)((long)plVar2 + sVar5));
      *(char *)((long)plVar2 + sVar5) = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  sVar3 = local_40;
  plVar2 = local_48;
  if (local_40 == 0) {
    if (local_60 == 0) {
      bVar7 = true;
      plVar6 = local_48;
      goto LAB_00106817;
    }
  }
  else {
    sVar5 = 0;
    do {
      iVar4 = tolower((int)*(char *)((long)plVar2 + sVar5));
      plVar6 = local_48;
      *(char *)((long)plVar2 + sVar5) = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
    if (local_60 == local_40) {
      if (local_40 == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_68,local_48,local_40);
        bVar7 = iVar4 == 0;
      }
      goto LAB_00106817;
    }
  }
  bVar7 = false;
  plVar6 = local_48;
LAB_00106817:
  if (plVar6 != local_38) {
    operator_delete(plVar6,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return bVar7;
}

Assistant:

bool Interpreter::Equals(const std::string& a, const std::string& b)
{
    std::string aa = a, bb = b;
    std::transform(aa.begin(), aa.end(), aa.begin(), ::tolower);
    std::transform(bb.begin(), bb.end(), bb.begin(), ::tolower);
    return aa == bb;
}